

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

int __thiscall mpt::source<double>::advance(source<double> *this)

{
  long lVar1;
  long lVar2;
  int local_34;
  source<double> *this_local;
  
  if ((this->_pos < 0) ||
     (lVar1 = this->_pos, lVar2 = span<const_double>::size(&this->super_span<const_double>),
     lVar2 <= lVar1)) {
    return -0x10;
  }
  this->_pos = (long)this->_step + this->_pos;
  if ((-1 < this->_pos) &&
     (lVar1 = this->_pos, lVar2 = span<const_double>::size(&this->super_span<const_double>),
     lVar1 < lVar2)) {
    if (this->_type == 0) {
      local_34 = type_properties<mpt::value>::id(true);
    }
    else {
      local_34 = this->_type;
    }
    return local_34;
  }
  return 0;
}

Assistant:

int advance() __MPT_OVERRIDE
	{
		if (_pos < 0 || _pos >= span<const T>::size()) {
			return MissingData;
		}
		_pos += _step;
		if (_pos < 0 || _pos >= span<const T>::size()) {
			return 0;
		}
		return _type ? _type : type_properties<struct value>::id(true);
	}